

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O1

void __thiscall JUnitTestOutput::writeTestCases(JUnitTestOutput *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  JUnitTestCaseResultNode *this_00;
  SimpleString SStack_48;
  char *local_40;
  SimpleString buf;
  
  this_00 = (this->impl_->results_).head_;
  if (this_00 != (JUnitTestCaseResultNode *)0x0) {
    do {
      local_40 = SimpleString::asCharString(&this->impl_->package_);
      bVar2 = SimpleString::isEmpty(&this->impl_->package_);
      pcVar5 = ".";
      if (bVar2) {
        pcVar5 = "";
      }
      pcVar3 = SimpleString::asCharString(&(this->impl_->results_).group_);
      pcVar4 = SimpleString::asCharString(&this_00->name_);
      auVar1 = SEXT816(this_00->execTime_) * SEXT816(0x20c49ba5e353f7cf);
      uVar6 = (int)(auVar1._8_8_ >> 7) - (auVar1._12_4_ >> 0x1f);
      StringFromFormat((char *)&buf,"<testcase classname=\"%s%s%s\" name=\"%s\" time=\"%d.%03d\">\n"
                       ,local_40,pcVar5,pcVar3,pcVar4,(ulong)uVar6,
                       (ulong)((int)this_00->execTime_ + uVar6 * -1000));
      pcVar5 = SimpleString::asCharString(&buf);
      SimpleString::SimpleString(&SStack_48,pcVar5);
      (*(this->super_TestOutput)._vptr_TestOutput[0x18])(this,&SStack_48);
      SimpleString::~SimpleString(&SStack_48);
      if (this_00->failure_ == (TestFailure *)0x0) {
        if (this_00->ignored_ == true) {
          SimpleString::SimpleString(&SStack_48,"<skipped />\n");
          (*(this->super_TestOutput)._vptr_TestOutput[0x18])(this,&SStack_48);
          SimpleString::~SimpleString(&SStack_48);
        }
      }
      else {
        (*(this->super_TestOutput)._vptr_TestOutput[0x1e])(this,this_00);
      }
      SimpleString::SimpleString(&SStack_48,"</testcase>\n");
      (*(this->super_TestOutput)._vptr_TestOutput[0x18])(this,&SStack_48);
      SimpleString::~SimpleString(&SStack_48);
      this_00 = this_00->next_;
      SimpleString::~SimpleString(&buf);
    } while (this_00 != (JUnitTestCaseResultNode *)0x0);
  }
  return;
}

Assistant:

void JUnitTestOutput::writeTestCases()
{
    JUnitTestCaseResultNode* cur = impl_->results_.head_;
    while (cur) {
        SimpleString buf = StringFromFormat(
                "<testcase classname=\"%s%s%s\" name=\"%s\" time=\"%d.%03d\">\n",
                impl_->package_.asCharString(),
                impl_->package_.isEmpty() == true ? "" : ".",
                impl_->results_.group_.asCharString(),
                cur->name_.asCharString(), (int) (cur->execTime_ / 1000), (int)(cur->execTime_ % 1000));
        writeToFile(buf.asCharString());

        if (cur->failure_) {
            writeFailure(cur);
        }
        else if (cur->ignored_) {
            writeToFile("<skipped />\n");
        }
        writeToFile("</testcase>\n");
        cur = cur->next_;
    }
}